

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

bool __thiscall tinyusdz::MetaVariable::get_value<tinyusdz::Token>(MetaVariable *this,Token *dst)

{
  Token *pTVar1;
  bool bVar2;
  
  if (dst == (Token *)0x0) {
    bVar2 = false;
  }
  else {
    pTVar1 = tinyusdz::value::Value::as<tinyusdz::Token>(&this->_value,false);
    bVar2 = pTVar1 != (Token *)0x0;
    if (bVar2) {
      ::std::__cxx11::string::_M_assign((string *)dst);
    }
  }
  return bVar2;
}

Assistant:

bool get_value(T *dst) const {
    if (!dst) {
      return false;
    }

    if (const T *v = _value.as<T>()) {
      (*dst) = *v;
      return true;
    }

    return false;
  }